

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void qcc_arena_init(qcc_arena *arena,void *buffer,size_t size)

{
  arena->buffer_start = (uint8_t *)buffer;
  arena->buffer_end = (uint8_t *)(size + (long)buffer);
  arena->free_memory = (uint8_t *)buffer;
  arena->objects = (qcc_arena_object *)(size + (long)buffer);
  arena->array_start = (uint8_t *)0x0;
  arena->array_end = (uint8_t *)0x0;
  return;
}

Assistant:

void qcc_arena_init(struct qcc_arena *arena, void *buffer, size_t size)
{
    arena->buffer_start = (uint8_t *)buffer;
    arena->buffer_end = arena->buffer_start + size;
    arena->free_memory = arena->buffer_start;
    arena->objects = (struct qcc_arena_object *)arena->buffer_end;
    arena->array_start = 0;
    arena->array_end = 0;
}